

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtest.cpp
# Opt level: O1

void __thiscall
DumpMetaArrayVal<short>::operator()(DumpMetaArrayVal<short> *this,PtexMetaData *meta,char *key)

{
  ulong uVar1;
  ulong uVar2;
  int count;
  short *val;
  uint local_34;
  long local_30;
  
  local_30 = 0;
  local_34 = 0;
  (*meta->_vptr_PtexMetaData[10])(meta,key,&local_30,&local_34);
  uVar1 = (ulong)local_34;
  if (0 < (int)local_34) {
    uVar2 = 0;
    do {
      if (((int)uVar2 == (int)((uVar2 & 0xffffffff) / 10) * 10) && (uVar2 != 0 || 10 < (int)uVar1))
      {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n  ",3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      std::ostream::operator<<((ostream *)&std::cout,*(short *)(local_30 + uVar2 * 2));
      uVar2 = uVar2 + 1;
      uVar1 = (ulong)(int)local_34;
    } while ((long)uVar2 < (long)uVar1);
  }
  return;
}

Assistant:

void operator()(PtexMetaData* meta, const char* key)
    {
        const T* val=0;
        int count=0;
        meta->getValue(key, val, count);
        for (int i = 0; i < count; i++) {
            if (i%10==0 && (i || count > 10)) std::cout << "\n  ";
            std::cout <<  "  " << val[i];
        }
    }